

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O1

int exception_decrement_reference(exception ex)

{
  atomic_uintmax_t aVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((ex != (exception)0x0) && (aVar1 = (ex->ref).count, aVar1 != 0)) {
    LOCK();
    (ex->ref).count = (ex->ref).count - 1;
    UNLOCK();
    if (aVar1 != 0) {
      LOCK();
      exception_stats.decrements = exception_stats.decrements + 1;
      UNLOCK();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int exception_decrement_reference(exception ex)
{
	if (ex == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_decrement(&ex->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_decrement(exception_stats);

	return 0;
}